

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

RegOpnd * __thiscall
Lowerer::GenerateCachedTypeCheck
          (Lowerer *this,Instr *instrChk,PropertySymOpnd *propertySymOpnd,
          LabelInstr *labelObjCheckFailed,LabelInstr *labelTypeCheckFailed,
          LabelInstr *labelSecondChance)

{
  Func *func;
  ObjTypeSpecFldInfo *this_00;
  Sym *pSVar1;
  code *pcVar2;
  JITTypeHolderBase<void> type;
  bool bVar3;
  BYTE scale;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  RegOpnd *typeOpnd;
  IndirOpnd *src;
  JitEquivalentTypeGuard *typeCheckGuard;
  JitPolyEquivalentTypeGuard *pJVar11;
  AddrOpnd *pAVar12;
  JITType *this_01;
  intptr_t address;
  JITTimeFunctionBody *pJVar13;
  FunctionJITTimeInfo *pFVar14;
  char16 *pcVar15;
  void *pvVar16;
  LabelInstr *target;
  BranchInstr *pBVar17;
  LabelInstr *target_00;
  HelperCallOpnd *src1Opnd;
  Instr *instr;
  char16_t *pcVar18;
  Lowerer *pLVar19;
  JITTypeHolder JVar20;
  LowererMD *this_02;
  nullptr_t local_498;
  WCHAR prefixValue [512];
  JITTypeHolderBase<void> local_78;
  JITTypeHolder directCheckType;
  IndirOpnd *local_68;
  RegOpnd *local_60;
  JITTypeHolderBase<void> local_50;
  JITTypeHolder monoType;
  
  if ((propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
     ((bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(propertySymOpnd), !bVar3 &&
      (((ushort)propertySymOpnd->field_12 & 2) == 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1d96,"(propertySymOpnd->MayNeedTypeCheckProtection())",
                       "propertySymOpnd->MayNeedTypeCheckProtection()");
    if (!bVar3) goto LAB_005c8b7c;
    *puVar9 = 0;
  }
  func = instrChk->m_func;
  pRVar10 = IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,func);
  IR::Opnd::SetValueType
            (&pRVar10->super_Opnd,
             (ValueType)
             SUB42(*(undefined4 *)&(propertySymOpnd->super_SymOpnd).propertyOwnerValueType,0));
  bVar3 = IR::Opnd::IsNotTaggedValue(&pRVar10->super_Opnd);
  if (!bVar3) {
    LowererMD::GenerateObjectTest
              (&this->m_lowererMD,&pRVar10->super_Opnd,instrChk,labelObjCheckFailed,false);
  }
  typeOpnd = IR::RegOpnd::New(TyInt64,func);
  bVar3 = StackSym::IsConst(pRVar10->m_sym);
  if (((!bVar3) || (bVar3 = StackSym::IsIntConst(pRVar10->m_sym), bVar3)) ||
     (bVar3 = StackSym::IsFloatConst(pRVar10->m_sym), bVar3)) {
    src = IR::IndirOpnd::New(pRVar10,8,TyInt64,func,false);
  }
  else {
    pvVar16 = StackSym::GetConstAddress(pRVar10->m_sym,false);
    src = (IndirOpnd *)
          IR::MemRefOpnd::New((void *)((long)pvVar16 + 8),TyInt64,func,
                              AddrOpndKindDynamicObjectTypeRef);
  }
  InsertMove(&typeOpnd->super_Opnd,&src->super_Opnd,instrChk,true);
  bVar3 = IR::Instr::HasEquivalentTypeCheckBailOut(instrChk);
  directCheckType.t = (Type)typeOpnd;
  monoType.t = (Type)pRVar10;
  if ((bVar3) &&
     (((char)(propertySymOpnd->field_12).field_0.field_5.typeCheckSeqFlags < '\0' ||
      ((PropertySymOpnd *)instrChk->m_dst == propertySymOpnd)))) {
LAB_005c8348:
    local_60 = (RegOpnd *)0x0;
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_50,(JITType *)0x0);
    typeCheckGuard = CreateEquivalentTypeGuardAndLinkToGuardedProperties(this,propertySymOpnd);
    if ((typeCheckGuard->super_JitIndexedPropertyGuard).super_PropertyGuard.isPoly == true) {
      bVar3 = IR::PropertySymOpnd::ShouldUsePolyEquivTypeGuard(propertySymOpnd,this->m_func);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1dc4,"(propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func))",
                           "propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func)");
        if (!bVar3) goto LAB_005c8b7c;
        *puVar9 = 0;
      }
      local_60 = GeneratePolymorphicTypeIndex
                           (this,typeOpnd,(PropertyGuard *)typeCheckGuard,instrChk);
    }
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_78,(JITType *)0x0);
    bVar3 = true;
LAB_005c84cf:
    if (local_60 == (RegOpnd *)0x0) {
      local_68 = (IndirOpnd *)
                 IR::MemRefOpnd::New(typeCheckGuard,TyUint64,func,AddrOpndKindDynamicGuardValueRef);
      local_60 = (RegOpnd *)0x0;
    }
    else {
      pRVar10 = IR::RegOpnd::New(TyUint64,func);
      pJVar11 = Js::PropertyGuard::AsPolyTypeCheckGuard((PropertyGuard *)typeCheckGuard);
      pAVar12 = IR::AddrOpnd::New(pJVar11->polyValues,AddrOpndKindDynamicTypeCheckGuard,func,true,
                                  (Var)0x0);
      InsertMove(&pRVar10->super_Opnd,&pAVar12->super_Opnd,instrChk,true);
      scale = LowererMDArch::GetDefaultIndirScale();
      local_68 = IR::IndirOpnd::New(pRVar10,local_60,scale,TyUint64,func);
    }
  }
  else {
    if ((propertySymOpnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
       ((bVar3 = ObjTypeSpecFldInfo::HasEquivalentTypeSet(propertySymOpnd->objTypeSpecFldInfo),
        bVar3 && ((bVar3 = IR::PropertySymOpnd::HasFinalType(propertySymOpnd), !bVar3 ||
                  (bVar3 = IR::PropertySymOpnd::HasInitialType(propertySymOpnd), !bVar3)))))) {
      local_498 = (nullptr_t)0x0;
      bVar3 = JITTypeHolderBase<void>::operator!=(&propertySymOpnd->monoGuardType,&local_498);
      if ((!bVar3) &&
         (((propertySymOpnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0 &&
           (bVar3 = ObjTypeSpecFldInfo::IsPoly(propertySymOpnd->objTypeSpecFldInfo), bVar3)) ||
          (bVar3 = IR::Instr::HasTypeCheckBailOut(instrChk), bVar3)))) goto LAB_005c8348;
    }
    bVar3 = IR::Instr::HasEquivalentTypeCheckBailOut(instrChk);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1db8,"(doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut())",
                         "doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut()");
      if (!bVar3) goto LAB_005c8b7c;
      *puVar9 = 0;
    }
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_50,(JITType *)0x0);
    local_498 = (nullptr_t)0x0;
    bVar3 = JITTypeHolderBase<void>::operator!=(&propertySymOpnd->monoGuardType,&local_498);
    if (bVar3) {
      local_50.t = (propertySymOpnd->monoGuardType).t;
    }
    else {
      local_50.t = (Type)IR::PropertySymOpnd::GetType(propertySymOpnd);
    }
    typeCheckGuard =
         (JitEquivalentTypeGuard *)
         CreateTypePropertyGuardForGuardedProperties(this,(JITTypeHolder)local_50.t,propertySymOpnd)
    ;
    local_60 = (RegOpnd *)0x0;
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_78,(JITType *)0x0);
    if (typeCheckGuard != (JitEquivalentTypeGuard *)0x0) {
      bVar3 = false;
      goto LAB_005c84cf;
    }
    local_498 = (nullptr_t)0x0;
    bVar3 = JITTypeHolderBase<void>::operator!=(&local_50,&local_498);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1dd3,"(monoType != nullptr)","monoType != nullptr");
      if (!bVar3) goto LAB_005c8b7c;
      *puVar9 = 0;
    }
    this_01 = JITTypeHolderBase<void>::operator->(&local_50);
    address = JITType::GetAddr(this_01);
    typeCheckGuard = (JitEquivalentTypeGuard *)0x0;
    local_68 = (IndirOpnd *)IR::AddrOpnd::New(address,AddrOpndKindDynamicType,func,true,(Var)0x0);
    local_78.t = local_50.t;
    local_60 = (RegOpnd *)0x0;
    bVar3 = false;
  }
  pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
  pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
  pLVar19 = (Lowerer *)&DAT_015b6718;
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ObjTypeSpecPhase,uVar5,uVar6);
  if ((bVar4) && (DAT_015bc46a == '\x01')) {
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ObjTypeSpecPhase,uVar5,uVar6);
    if (bVar4) {
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar13);
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
      pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar7 = JITTimeFunctionBody::GetFunctionNumber(pJVar13);
      swprintf_s<512ul>((WCHAR (*) [512])&local_498,L"%s (#%d.%u, #%u)",pcVar15,(ulong)uVar5,
                        (ulong)uVar6,(ulong)uVar7);
      prefixValue[0x1fc] = L'\0';
      prefixValue[0x1fd] = L'\0';
      prefixValue[0x1fe] = L'\0';
      prefixValue[0x1ff] = L'\0';
      bVar4 = JITTypeHolderBase<void>::operator!=(&local_78,(nullptr_t *)(prefixValue + 0x1fc));
      if (bVar4) {
        pcVar18 = L"direct";
      }
      else if (propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
        pcVar18 = L"indirect";
      }
      else {
        bVar4 = ObjTypeSpecFldInfo::IsPoly(propertySymOpnd->objTypeSpecFldInfo);
        pcVar18 = L"indirect";
        if (bVar4) {
          pcVar18 = L"equivalent";
        }
      }
      Output::TraceWithPrefix
                (ObjTypeSpecPhase,(char16 *)&local_498,L"Emitted %s type check ",pcVar18);
    }
    if (propertySymOpnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pLVar19 = (Lowerer *)0xfbee92;
      Output::Print(L"\n");
    }
    else {
      Output::Print(L" guarding operations:\n    ");
      pLVar19 = (Lowerer *)propertySymOpnd->guardedPropOps;
      BVSparse<Memory::JitArenaAllocator>::Dump((BVSparse<Memory::JitArenaAllocator> *)pLVar19);
    }
    Output::Flush();
  }
  JVar20.t = directCheckType.t;
  if (bVar3) {
    pLVar19 = (Lowerer *)0x176;
    target = IR::LabelInstr::New(Label,func,true);
    pBVar17 = InsertCompareBranch(pLVar19,(Opnd *)directCheckType.t,&local_68->super_Opnd,BrNeq_A,
                                  false,target,instrChk,false);
    LowererMD::InsertObjectPoison((Opnd *)monoType.t,pBVar17,instrChk,false);
    target_00 = IR::LabelInstr::New(Label,func,false);
    InsertBranch(Br,false,target_00,instrChk);
    IR::Instr::InsertBefore(instrChk,&target->super_Instr);
    pAVar12 = IR::AddrOpnd::New(typeCheckGuard,AddrOpndKindDynamicTypeCheckGuard,func,true,(Var)0x0)
    ;
    this_00 = propertySymOpnd->objTypeSpecFldInfo;
    if (local_60 == (RegOpnd *)0x0) {
      if (this_00 == (ObjTypeSpecFldInfo *)0x0) {
        monoType.t._0_4_ = 0x101;
      }
      else {
        bVar3 = ObjTypeSpecFldInfo::HasFixedValue(this_00);
        monoType.t._0_4_ = bVar3 + 0x101;
      }
    }
    else {
      if (this_00 == (ObjTypeSpecFldInfo *)0x0) {
        iVar8 = 0x103;
      }
      else {
        bVar3 = ObjTypeSpecFldInfo::HasFixedValue(this_00);
        iVar8 = bVar3 + 0x103;
      }
      monoType.t._0_4_ = iVar8;
      LowererMD::LoadHelperArgument(&this->m_lowererMD,instrChk,&local_60->super_Opnd);
    }
    this_02 = &this->m_lowererMD;
    LowererMD::LoadHelperArgument(this_02,instrChk,&pAVar12->super_Opnd);
    JVar20 = directCheckType;
    LowererMD::LoadHelperArgument(this_02,instrChk,(Opnd *)directCheckType.t);
    pRVar10 = IR::RegOpnd::New(TyUint8,func);
    src1Opnd = IR::HelperCallOpnd::New((JnHelperMethod)monoType.t,func);
    instr = IR::Instr::New(Call,&pRVar10->super_Opnd,&src1Opnd->super_Opnd,func);
    IR::Instr::InsertBefore(instrChk,instr);
    LowererMD::LowerCall(this_02,instr,0);
    InsertTest(&pRVar10->super_Opnd,&pRVar10->super_Opnd,instrChk);
    InsertBranch(BrEq_A,false,labelTypeCheckFailed,instrChk);
    IR::Instr::InsertBefore(instrChk,&target_00->super_Instr);
  }
  else {
    if (labelSecondChance != (LabelInstr *)0x0) {
      labelTypeCheckFailed = labelSecondChance;
    }
    pBVar17 = InsertCompareBranch(pLVar19,(Opnd *)directCheckType.t,&local_68->super_Opnd,BrNeq_A,
                                  false,labelTypeCheckFailed,instrChk,false);
    LowererMD::InsertObjectPoison((Opnd *)monoType.t,pBVar17,instrChk,false);
    local_498 = (nullptr_t)0x0;
    bVar3 = JITTypeHolderBase<void>::operator!=(&local_50,&local_498);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1e51,"(monoType != nullptr)","monoType != nullptr");
      if (!bVar3) goto LAB_005c8b7c;
      *puVar9 = 0;
    }
    type.t = (Type)local_50;
    pSVar1 = (propertySymOpnd->super_SymOpnd).m_sym;
    if (pSVar1->m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar3) {
LAB_005c8b7c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
      JVar20 = directCheckType;
    }
    PinTypeRef(this,(JITTypeHolder)type.t,type.t,instrChk,*(PropertyId *)&pSVar1[1]._vptr_Sym);
  }
  return (RegOpnd *)JVar20.t;
}

Assistant:

IR::RegOpnd *
Lowerer::GenerateCachedTypeCheck(IR::Instr *instrChk, IR::PropertySymOpnd *propertySymOpnd, IR::LabelInstr* labelObjCheckFailed, IR::LabelInstr *labelTypeCheckFailed, IR::LabelInstr *labelSecondChance)
{
    Assert(propertySymOpnd->MayNeedTypeCheckProtection());

    Func* func = instrChk->m_func;
    IR::RegOpnd *regOpnd = propertySymOpnd->CreatePropertyOwnerOpnd(func);
    regOpnd->SetValueType(propertySymOpnd->GetPropertyOwnerValueType());

    if (!regOpnd->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(regOpnd, instrChk, labelObjCheckFailed);
    }

    // Load the current object type into typeOpnd
    IR::RegOpnd* typeOpnd = IR::RegOpnd::New(TyMachReg, func);
    IR::Opnd *sourceType;
    if (regOpnd->m_sym->IsConst() && !regOpnd->m_sym->IsIntConst() && !regOpnd->m_sym->IsFloatConst())
    {
        sourceType = IR::MemRefOpnd::New((BYTE*)regOpnd->m_sym->GetConstAddress() +
            Js::RecyclableObject::GetOffsetOfType(), TyMachReg, func, IR::AddrOpndKindDynamicObjectTypeRef);
    }
    else
    {
        sourceType = IR::IndirOpnd::New(regOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, func);
    }
    InsertMove(typeOpnd, sourceType, instrChk);

    // Note: don't attempt equivalent type check if we're doing a final type optimization or if we have a monomorphic
    // cache and no type check bailout. In the latter case, we can wind up doing expensive failed equivalence checks
    // repeatedly and never rejit.
    bool doEquivTypeCheck =
        (instrChk->HasEquivalentTypeCheckBailOut() && (propertySymOpnd->TypeCheckRequired() || propertySymOpnd == instrChk->GetDst())) ||
        (propertySymOpnd->HasEquivalentTypeSet() &&
         !(propertySymOpnd->HasFinalType() && propertySymOpnd->HasInitialType()) &&
         !propertySymOpnd->MustDoMonoCheck() &&
         (propertySymOpnd->IsPoly() || instrChk->HasTypeCheckBailOut()));
    Assert(doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut());

    // Create and initialize the property guard if required. Note that for non-shared monomorphic checks we can refer
    // directly to the (pinned) type and not use a guard.
    Js::PropertyGuard * typeCheckGuard;
    IR::RegOpnd * polyIndexOpnd = nullptr;
    JITTypeHolder monoType = nullptr;
    if (doEquivTypeCheck)
    {
        typeCheckGuard = CreateEquivalentTypeGuardAndLinkToGuardedProperties(propertySymOpnd);
        if (typeCheckGuard->IsPoly())
        {
            Assert(propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func));
            polyIndexOpnd = this->GeneratePolymorphicTypeIndex(typeOpnd, typeCheckGuard, instrChk);
        }
    }
    else
    {
        monoType = propertySymOpnd->MustDoMonoCheck() ? propertySymOpnd->GetMonoGuardType() : propertySymOpnd->GetType();
        typeCheckGuard = this->CreateTypePropertyGuardForGuardedProperties(monoType, propertySymOpnd);
    }

    // Create the opnd we will check against the current type.
    IR::Opnd *expectedTypeOpnd;
    JITTypeHolder directCheckType = nullptr;
    if (typeCheckGuard == nullptr)
    {
        Assert(monoType != nullptr);
        expectedTypeOpnd = IR::AddrOpnd::New(monoType->GetAddr(), IR::AddrOpndKindDynamicType, func, true);
        directCheckType = monoType;
    }
    else
    {
        Assert(Js::PropertyGuard::GetSizeOfValue() == static_cast<size_t>(TySize[TyMachPtr]));

        if (this->m_func->IsOOPJIT())
        {
            if (polyIndexOpnd != nullptr)
            {
                IR::RegOpnd * baseOpnd = IR::RegOpnd::New(TyMachPtr, func);
                this->GenerateLeaOfOOPData(baseOpnd, typeCheckGuard, Js::JitPolyEquivalentTypeGuard::GetOffsetOfPolyValues(), instrChk);
                expectedTypeOpnd = IR::IndirOpnd::New(baseOpnd, polyIndexOpnd, m_lowererMD.GetDefaultIndirScale(), TyMachPtr, func);
            }
            else
            {
                expectedTypeOpnd = this->GenerateIndirOfOOPData(typeCheckGuard, 0, instrChk);
            }
            this->addToLiveOnBackEdgeSyms->Set(func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            if (polyIndexOpnd != nullptr)
            {
                IR::RegOpnd * baseOpnd = IR::RegOpnd::New(TyMachPtr, func);
                InsertMove(baseOpnd, IR::AddrOpnd::New((Js::Var)typeCheckGuard->AsPolyTypeCheckGuard()->GetAddressOfPolyValues(), IR::AddrOpndKindDynamicTypeCheckGuard, func, true), instrChk);
                expectedTypeOpnd = IR::IndirOpnd::New(baseOpnd, polyIndexOpnd, m_lowererMD.GetDefaultIndirScale(), TyMachPtr, func);
            }
            else
            {
                expectedTypeOpnd = IR::MemRefOpnd::New((void*)(typeCheckGuard->GetAddressOfValue()), TyMachPtr, func, IR::AddrOpndKindDynamicGuardValueRef);
            }
        }
    }

    if (PHASE_VERBOSE_TRACE(Js::ObjTypeSpecPhase, this->m_func))
    {
        OUTPUT_VERBOSE_TRACE_FUNC(Js::ObjTypeSpecPhase, this->m_func, _u("Emitted %s type check "),
            directCheckType != nullptr ? _u("direct") : propertySymOpnd->IsPoly() ? _u("equivalent") : _u("indirect"));
#if DBG
        if (propertySymOpnd->GetGuardedPropOps() != nullptr)
        {
            Output::Print(_u(" guarding operations:\n    "));
            propertySymOpnd->GetGuardedPropOps()->Dump();
        }
        else
        {
            Output::Print(_u("\n"));
        }
#else
        Output::Print(_u("\n"));
#endif
        Output::Flush();
    }

    if (doEquivTypeCheck)
    {
        // TODO (ObjTypeSpec): For isolated equivalent type checks it would be good to emit a check if the cache is still valid, and
        // if not go straight to live polymorphic cache.  This way we wouldn't have to bail out and re-JIT, and also wouldn't continue
        // to try the equivalent type cache, miss it and do the slow comparison. This may be as easy as sticking a null on the main
        // type in the equivalent type cache.
        IR::LabelInstr* labelCheckEquivalentType = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        IR::BranchInstr* branchInstr = InsertCompareBranch(typeOpnd, expectedTypeOpnd, Js::OpCode::BrNeq_A, labelCheckEquivalentType, instrChk);

        InsertObjectPoison(regOpnd, branchInstr, instrChk, false);

        IR::LabelInstr *labelTypeCheckSucceeded = IR::LabelInstr::New(Js::OpCode::Label, func, false);
        InsertBranch(Js::OpCode::Br, labelTypeCheckSucceeded, instrChk);

        instrChk->InsertBefore(labelCheckEquivalentType);

        IR::Opnd* typeCheckGuardOpnd = nullptr;
        if (this->m_func->IsOOPJIT())
        {
            typeCheckGuardOpnd = IR::RegOpnd::New(TyMachPtr, func);
            this->GenerateLeaOfOOPData(typeCheckGuardOpnd->AsRegOpnd(), typeCheckGuard, 0, instrChk);
            this->addToLiveOnBackEdgeSyms->Set(func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            typeCheckGuardOpnd = IR::AddrOpnd::New((Js::Var)typeCheckGuard, IR::AddrOpndKindDynamicTypeCheckGuard, func, true);
        }

        IR::JnHelperMethod helperMethod;
        if (polyIndexOpnd != nullptr)
        {
            helperMethod = propertySymOpnd->HasFixedValue() ? IR::HelperCheckIfPolyTypeIsEquivalentForFixedField : IR::HelperCheckIfPolyTypeIsEquivalent;

            this->m_lowererMD.LoadHelperArgument(instrChk, polyIndexOpnd);
        }
        else
        {
            helperMethod = propertySymOpnd->HasFixedValue() ? IR::HelperCheckIfTypeIsEquivalentForFixedField : IR::HelperCheckIfTypeIsEquivalent;
        }
        this->m_lowererMD.LoadHelperArgument(instrChk, typeCheckGuardOpnd);
        this->m_lowererMD.LoadHelperArgument(instrChk, typeOpnd);

        IR::RegOpnd* equivalentTypeCheckResultOpnd = IR::RegOpnd::New(TyUint8, func);
        IR::HelperCallOpnd* equivalentTypeCheckHelperCallOpnd = IR::HelperCallOpnd::New(helperMethod, func);
        IR::Instr* equivalentTypeCheckCallInstr = IR::Instr::New(Js::OpCode::Call, equivalentTypeCheckResultOpnd, equivalentTypeCheckHelperCallOpnd, func);
        instrChk->InsertBefore(equivalentTypeCheckCallInstr);
        this->m_lowererMD.LowerCall(equivalentTypeCheckCallInstr, 0);

        InsertTestBranch(equivalentTypeCheckResultOpnd, equivalentTypeCheckResultOpnd, Js::OpCode::BrEq_A, labelTypeCheckFailed, instrChk);

        // TODO (ObjTypeSpec): Consider emitting a shared bailout to which a specific bailout kind is written at runtime. This would allow us to distinguish
        // between non-equivalent type and other cases, such as invalidated guard (due to fixed field overwrite, perhaps) or too much thrashing on the
        // equivalent type cache. We could determine bailout kind based on the value returned by the helper. In the case of cache thrashing we could just
        // turn off the whole optimization for a given function.

        instrChk->InsertBefore(labelTypeCheckSucceeded);
    }
    else
    {
        IR::BranchInstr* branchInstr = InsertCompareBranch(typeOpnd, expectedTypeOpnd, Js::OpCode::BrNeq_A, labelSecondChance != nullptr ? labelSecondChance : labelTypeCheckFailed, instrChk);
        InsertObjectPoison(regOpnd, branchInstr, instrChk, false);
    }

    // Don't pin the type for polymorphic operations. The code can successfully execute even if this type is no longer referenced by any objects,
    // as long as there are other objects with types equivalent on the properties referenced by this code. The type is kept alive until entry point
    // installation by the JIT transfer data, and after that by the equivalent type cache, so it will stay alive unless or until it gets evicted
    // from the cache.
    if (!doEquivTypeCheck)
    {
        Assert(monoType != nullptr);
        PinTypeRef(monoType, monoType.t, instrChk, propertySymOpnd->m_sym->AsPropertySym()->m_propertyId);
    }

    return typeOpnd;
}